

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init
          (shaderCollectionForTextureFormat *this,EVP_PKEY_CTX *ctx)

{
  samplerType sVar1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  pointer this_00;
  vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>
  *in_RCX;
  long in_RDX;
  TextureCubeMapArraySamplingTest *in_R8;
  __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
  local_b0;
  const_iterator end_1;
  const_iterator it_1;
  iterator jt;
  const_iterator end;
  const_iterator it;
  uint local_74;
  undefined1 local_70 [4];
  GLuint n_routines_supporting_format;
  string pass_through_tesselation_evaluation_shader_source;
  string pass_through_fragment_shader_source;
  TextureCubeMapArraySamplingTest *test_local;
  samplingFunctionsVectorType *sampling_routines_local;
  formatDefinition *format_local;
  Functions *gl_local;
  shaderCollectionForTextureFormat *this_local;
  
  std::__cxx11::string::string
            ((string *)(pass_through_tesselation_evaluation_shader_source.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string((string *)local_70);
  local_74 = 0;
  getPassThroughFragmentShaderCode
            (in_R8,*(samplerType *)(in_RDX + 0x20),
             (string *)(pass_through_tesselation_evaluation_shader_source.field_2._M_local_buf + 8))
  ;
  getPassThroughTesselationEvaluationShaderCode
            (in_R8,*(samplerType *)(in_RDX + 0x20),(string *)local_70);
  shaderDefinition::init(&this->pass_through_fragment_shader,ctx);
  if (((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    shaderDefinition::init(&this->pass_through_tesselation_evaluation_shader,ctx);
  }
  compile(in_R8,&this->pass_through_fragment_shader);
  if (((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    compile(in_R8,&this->pass_through_tesselation_evaluation_shader);
  }
  end = std::
        vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>
        ::begin(in_RCX);
  jt._M_current =
       (shaderCollectionForSamplingRoutine *)
       std::
       vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>
       ::end(in_RCX);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
                             *)&jt,&end), bVar2) {
    sVar1 = *(samplerType *)(in_RDX + 0x20);
    psVar4 = __gnu_cxx::
             __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
             ::operator->(&end);
    bVar2 = isSamplerSupportedByFunction(sVar1,psVar4->m_function);
    if (bVar2) {
      local_74 = local_74 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
    ::operator++(&end);
  }
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
  ::resize(&this->per_sampling_routine,(ulong)local_74);
  it_1._M_current =
       (samplingFunctionDefinition *)
       std::
       vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
       ::begin(&this->per_sampling_routine);
  end_1 = std::
          vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>
          ::begin(in_RCX);
  local_b0._M_current =
       (samplingFunctionDefinition *)
       std::
       vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>
       ::end(in_RCX);
  while (bVar2 = __gnu_cxx::operator!=(&local_b0,&end_1), bVar2) {
    sVar1 = *(samplerType *)(in_RDX + 0x20);
    psVar4 = __gnu_cxx::
             __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
             ::operator->(&end_1);
    bVar2 = isSamplerSupportedByFunction(sVar1,psVar4->m_function);
    if (bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>_>
                ::operator->((__normal_iterator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>_>
                              *)&it_1);
      __gnu_cxx::
      __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
      ::operator->(&end_1);
      shaderCollectionForSamplingRoutine::init(this_00,ctx);
      __gnu_cxx::
      __normal_iterator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>_>
      ::operator++((__normal_iterator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>_>
                    *)&it_1);
    }
    __gnu_cxx::
    __normal_iterator<const_glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition_*,_std::vector<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition,_std::allocator<glcts::TextureCubeMapArraySamplingTest::samplingFunctionDefinition>_>_>
    ::operator++(&end_1);
  }
  std::__cxx11::string::~string((string *)local_70);
  iVar3 = std::__cxx11::string::~string
                    ((string *)
                     (pass_through_tesselation_evaluation_shader_source.field_2._M_local_buf + 8));
  return iVar3;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init(
	const glw::Functions& gl, const formatDefinition& format, const samplingFunctionsVectorType& sampling_routines,
	TextureCubeMapArraySamplingTest& test)
{
	std::string pass_through_fragment_shader_source;
	std::string pass_through_tesselation_evaluation_shader_source;
	glw::GLuint n_routines_supporting_format = 0;

	test.getPassThroughFragmentShaderCode(format.m_sampler_type, pass_through_fragment_shader_source);
	test.getPassThroughTesselationEvaluationShaderCode(format.m_sampler_type,
													   pass_through_tesselation_evaluation_shader_source);

	pass_through_fragment_shader.init(gl, GL_FRAGMENT_SHADER, pass_through_fragment_shader_source, &test);

	if (test.m_is_tessellation_shader_supported)
	{
		pass_through_tesselation_evaluation_shader.init(gl, test.m_glExtTokens.TESS_EVALUATION_SHADER,
														pass_through_tesselation_evaluation_shader_source, &test);
	}

	test.compile(pass_through_fragment_shader);

	if (test.m_is_tessellation_shader_supported)
	{
		test.compile(pass_through_tesselation_evaluation_shader);
	}

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			n_routines_supporting_format += 1;
		}
	}

	per_sampling_routine.resize(n_routines_supporting_format);
	shaderCollectionForSamplingFunctionVectorType::iterator jt = per_sampling_routine.begin();

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			jt->init(gl, format, it->m_function, test);
			++jt;
		}
	}
}